

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_split.cpp
# Opt level: O1

void __thiscall BamTools::SplitTool::~SplitTool(SplitTool *this)

{
  SplitSettings *pSVar1;
  pointer pcVar2;
  SplitToolPrivate *this_00;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__SplitTool_001f32b0;
  pSVar1 = this->m_settings;
  if (pSVar1 != (SplitSettings *)0x0) {
    pcVar2 = (pSVar1->ListTagDelimiter)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->ListTagDelimiter).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pSVar1->TagToSplit)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->TagToSplit).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pSVar1->InputFilename)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->InputFilename).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pSVar1->CustomTagPrefix)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->CustomTagPrefix).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pSVar1->CustomRefPrefix)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->CustomRefPrefix).field_2) {
      operator_delete(pcVar2);
    }
    pcVar2 = (pSVar1->CustomOutputStub)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pSVar1->CustomOutputStub).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pSVar1);
  }
  this->m_settings = (SplitSettings *)0x0;
  this_00 = this->m_impl;
  if (this_00 != (SplitToolPrivate *)0x0) {
    SplitToolPrivate::~SplitToolPrivate(this_00);
    operator_delete(this_00);
  }
  this->m_impl = (SplitToolPrivate *)0x0;
  return;
}

Assistant:

SplitTool::~SplitTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}